

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O2

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
args::Command::GetCommandProgramLine_abi_cxx11_
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,Command *this,HelpParams *params)

{
  char cVar1;
  const_iterator __position;
  size_type sVar2;
  pointer pcVar3;
  bool bVar4;
  int iVar5;
  size_type sVar6;
  string line;
  allocator local_91;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  UpdateSubparserHelp(this,params);
  Group::GetProgramLine_abi_cxx11_(__return_storage_ptr__,&this->super_Group,params);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             __return_storage_ptr__,
             (__return_storage_ptr__->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish,
             (this->subparserProgramLine).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (this->subparserProgramLine).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  if ((params->proglineCommand)._M_string_length != 0) {
    bVar4 = Group::HasCommand(&this->super_Group);
    if ((bVar4) || (this->subparserHasCommand == true)) {
      __position._M_current =
           (__return_storage_ptr__->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
      bVar4 = this->commandIsRequired;
      if (bVar4 == true) {
        std::__cxx11::string::string((string *)&local_90,(string *)&params->proglineCommand);
      }
      else {
        std::operator+(&local_70,"[",&params->proglineCommand);
        std::operator+(&local_90,&local_70,"]");
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::insert(__return_storage_ptr__,__position,&local_90);
      std::__cxx11::string::~string((string *)&local_90);
      if (bVar4 == false) {
        std::__cxx11::string::~string((string *)&local_70);
      }
    }
  }
  if ((this->name)._M_string_length != 0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::insert(__return_storage_ptr__,
             (__return_storage_ptr__->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start,&this->name);
  }
  if (this->subparserHasFlag == false) {
    bVar4 = Group::HasFlag(&this->super_Group);
    if (!bVar4) goto LAB_0018f36b;
  }
  if ((params->showProglineOptions == true) && (params->proglineShowFlags == false)) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(__return_storage_ptr__,&params->proglineOptions);
  }
LAB_0018f36b:
  sVar2 = (this->proglinePostfix)._M_string_length;
  if (sVar2 != 0) {
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    local_90._M_string_length = 0;
    local_90.field_2._M_local_buf[0] = '\0';
    pcVar3 = (this->proglinePostfix)._M_dataplus._M_p;
    for (sVar6 = 0; sVar2 != sVar6; sVar6 = sVar6 + 1) {
      cVar1 = pcVar3[sVar6];
      iVar5 = isspace((int)cVar1);
      if (iVar5 == 0) {
        std::__cxx11::string::push_back((char)&local_90);
      }
      else {
        if (local_90._M_string_length != 0) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(__return_storage_ptr__,&local_90);
          local_90._M_string_length = 0;
          *local_90._M_dataplus._M_p = '\0';
        }
        if (cVar1 == '\n') {
          std::__cxx11::string::string((string *)&local_50,"\n",&local_91);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     __return_storage_ptr__,&local_50);
          std::__cxx11::string::~string((string *)&local_50);
        }
      }
    }
    if (local_90._M_string_length != 0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(__return_storage_ptr__,&local_90);
    }
    std::__cxx11::string::~string((string *)&local_90);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string> GetCommandProgramLine(const HelpParams &params) const
            {
                UpdateSubparserHelp(params);

                auto res = Group::GetProgramLine(params);
                res.insert(res.end(), subparserProgramLine.begin(), subparserProgramLine.end());

                if (!params.proglineCommand.empty() && (Group::HasCommand() || subparserHasCommand))
                {
                    res.insert(res.begin(), commandIsRequired ? params.proglineCommand : "[" + params.proglineCommand + "]");
                }

                if (!Name().empty())
                {
                    res.insert(res.begin(), Name());
                }

                if ((subparserHasFlag || Group::HasFlag()) && params.showProglineOptions && !params.proglineShowFlags)
                {
                    res.push_back(params.proglineOptions);
                }

                if (!ProglinePostfix().empty())
                {
                    std::string line;
                    for (char c : ProglinePostfix())
                    {
                        if (isspace(c))
                        {
                            if (!line.empty())
                            {
                                res.push_back(line);
                                line.clear();
                            }

                            if (c == '\n')
                            {
                                res.push_back("\n");
                            }
                        }
                        else
                        {
                            line += c;
                        }
                    }

                    if (!line.empty())
                    {
                        res.push_back(line);
                    }
                }

                return res;
            }